

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O1

int intersectRectQuad2(btScalar *h,btScalar *p,btScalar *ret)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  btScalar *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  btScalar *pbVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  btScalar *pbVar12;
  bool bVar13;
  float fVar14;
  btScalar buffer [16];
  btScalar *local_90;
  btScalar local_78 [18];
  
  uVar7 = 4;
  uVar3 = 0;
  local_90 = ret;
  do {
    uVar9 = uVar3 & 0xffffffff ^ 1;
    iVar10 = -1;
    do {
      uVar5 = 0;
      if ((int)uVar7 < 1) {
        iVar11 = 8;
      }
      else {
        fVar14 = (float)iVar10;
        iVar6 = uVar7 + 1;
        uVar5 = 0;
        pbVar4 = p;
        pbVar12 = local_90;
        do {
          if (pbVar4[uVar3] * fVar14 < h[uVar3]) {
            *pbVar12 = *pbVar4;
            pbVar12[1] = pbVar4[1];
            uVar5 = uVar5 + 1;
            if ((uVar5 & 8) != 0) {
              iVar11 = 0xb;
              p = local_90;
              goto LAB_00140f1f;
            }
            pbVar12 = pbVar12 + 2;
          }
          pbVar8 = pbVar4 + 2;
          if (iVar6 == 2) {
            pbVar8 = p;
          }
          fVar1 = pbVar4[uVar3];
          fVar2 = h[uVar3];
          bVar13 = true;
          if (fVar1 * fVar14 < fVar2 == pbVar8[uVar3] * fVar14 < fVar2) {
LAB_00140ee4:
            iVar11 = 0;
            pbVar4 = pbVar4 + 2;
          }
          else {
            pbVar12[uVar9] =
                 (fVar2 * fVar14 - fVar1) *
                 ((pbVar8[uVar9] - pbVar4[uVar9]) / (pbVar8[uVar3] - fVar1)) + pbVar4[uVar9];
            pbVar12[uVar3] = h[uVar3] * fVar14;
            pbVar12 = pbVar12 + 2;
            uVar5 = uVar5 + 1;
            if ((uVar5 & 8) == 0) goto LAB_00140ee4;
            iVar11 = 0xb;
            bVar13 = false;
            p = local_90;
          }
          if (!bVar13) goto LAB_00140f1f;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
        iVar11 = 8;
      }
LAB_00140f1f:
      if (iVar11 == 8) {
        pbVar4 = ret;
        if (local_90 == ret) {
          pbVar4 = local_78;
        }
        iVar11 = 0;
        p = local_90;
        local_90 = pbVar4;
        uVar7 = uVar5;
      }
      if (iVar11 != 0) goto LAB_00140f65;
      bVar13 = iVar10 < 0;
      iVar10 = iVar10 + 2;
    } while (bVar13);
    iVar11 = 5;
LAB_00140f65:
    if (iVar11 != 5) goto LAB_00140f81;
    bVar13 = uVar3 == 0;
    uVar3 = uVar3 + 1;
  } while (bVar13);
  iVar11 = 2;
LAB_00140f81:
  if (((iVar11 == 0xb) || (iVar11 == 2)) && (p != ret)) {
    memcpy(ret,p,(long)(int)(uVar5 * 2) << 2);
  }
  return uVar5;
}

Assistant:

static int intersectRectQuad2 (btScalar h[2], btScalar p[8], btScalar ret[16])
{
  // q (and r) contain nq (and nr) coordinate points for the current (and
  // chopped) polygons
  int nq=4,nr=0;
  btScalar buffer[16];
  btScalar *q = p;
  btScalar *r = ret;
  for (int dir=0; dir <= 1; dir++) {
    // direction notation: xy[0] = x axis, xy[1] = y axis
    for (int sign=-1; sign <= 1; sign += 2) {
      // chop q along the line xy[dir] = sign*h[dir]
      btScalar *pq = q;
      btScalar *pr = r;
      nr = 0;
      for (int i=nq; i > 0; i--) {
	// go through all points in q and all lines between adjacent points
	if (sign*pq[dir] < h[dir]) {
	  // this point is inside the chopping line
	  pr[0] = pq[0];
	  pr[1] = pq[1];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	btScalar *nextq = (i > 1) ? pq+2 : q;
	if ((sign*pq[dir] < h[dir]) ^ (sign*nextq[dir] < h[dir])) {
	  // this line crosses the chopping line
	  pr[1-dir] = pq[1-dir] + (nextq[1-dir]-pq[1-dir]) /
	    (nextq[dir]-pq[dir]) * (sign*h[dir]-pq[dir]);
	  pr[dir] = sign*h[dir];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	pq += 2;
      }
      q = r;
      r = (q==ret) ? buffer : ret;
      nq = nr;
    }
  }
 done:
  if (q != ret) memcpy (ret,q,nr*2*sizeof(btScalar));
  return nr;
}